

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O2

Result __thiscall
wabt::interp::anon_unknown_0::BinaryReaderInterp::GetReturnCallDropKeepCount
          (BinaryReaderInterp *this,FuncType *func_type,Index keep_extra,Index *out_drop_count,
          Index *out_keep_count)

{
  Result RVar1;
  Index IVar2;
  Index keep_count;
  
  keep_count = (int)((ulong)((long)(func_type->params).
                                   super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                            (long)(func_type->params).
                                  super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                  _M_impl.super__Vector_impl_data._M_start) >> 2) + keep_extra;
  RVar1 = GetDropCount(this,keep_count,0,out_drop_count);
  if (RVar1.enum_ != Error) {
    IVar2 = SharedValidator::GetLocalCount(&this->validator_);
    *out_drop_count = *out_drop_count + IVar2;
    *out_keep_count = keep_count;
  }
  return (Result)(uint)(RVar1.enum_ == Error);
}

Assistant:

Result BinaryReaderInterp::GetReturnCallDropKeepCount(const FuncType& func_type,
                                                      Index keep_extra,
                                                      Index* out_drop_count,
                                                      Index* out_keep_count) {
  Index keep_count = static_cast<Index>(func_type.params.size()) + keep_extra;
  CHECK_RESULT(GetDropCount(keep_count, 0, out_drop_count));
  *out_drop_count += validator_.GetLocalCount();
  *out_keep_count = keep_count;
  return Result::Ok;
}